

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall argstest::ArgumentParser::LongSeparator(ArgumentParser *this,string *longseparator_)

{
  pointer pcVar1;
  string errorMessage;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (longseparator_->_M_string_length == 0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"longseparator can not be set to empty","");
    (this->super_Command).super_Group.super_Base.error = Usage;
    std::__cxx11::string::_M_assign
              ((string *)&(this->super_Command).super_Group.super_Base.errorMsg);
    if (local_38[0] == local_28) {
      return;
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->longseparator);
    local_38[0] = local_28;
    if (this->allowJoinedLongValue == true) {
      pcVar1 = (longseparator_->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_38,pcVar1,pcVar1 + longseparator_->_M_string_length);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38," ","");
    }
    std::__cxx11::string::_M_assign((string *)&(this->helpParams).longSeparator);
    if (local_38[0] == local_28) {
      return;
    }
  }
  operator_delete(local_38[0]);
  return;
}

Assistant:

void LongSeparator(const std::string &longseparator_)
            {
                if (longseparator_.empty())
                {
                    const std::string errorMessage("longseparator can not be set to empty");
#ifdef ARGS_NOEXCEPT
                    error = Error::Usage;
                    errorMsg = errorMessage;
#else
                    throw UsageError(errorMessage);
#endif
                } else
                {
                    this->longseparator = longseparator_;
                    this->helpParams.longSeparator = allowJoinedLongValue ? longseparator_ : " ";
                }
            }